

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__extend_receive(stbi__jpeg *j,int n)

{
  stbi__uint32 sVar1;
  uint uVar2;
  uint uVar3;
  bool local_1d;
  int sgn;
  uint k;
  int n_local;
  stbi__jpeg *j_local;
  
  if (j->code_bits < n) {
    stbi__grow_buffer_unsafe(j);
  }
  sVar1 = j->code_buffer;
  uVar3 = j->code_buffer << ((byte)n & 0x1f) | j->code_buffer >> (0x20 - (byte)n & 0x1f);
  local_1d = 0x10 < (uint)n;
  if (local_1d) {
    __assert_fail("n >= 0 && n < (int) (sizeof(stbi__bmask)/sizeof(*stbi__bmask))",
                  "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                  ,0x671,"int stbi__extend_receive(stbi__jpeg *, int)");
  }
  j->code_buffer = uVar3 & (stbi__bmask[n] ^ 0xffffffff);
  uVar2 = stbi__bmask[n];
  j->code_bits = j->code_bits - n;
  return (uVar2 & uVar3) + (stbi__jbias[n] & ((int)sVar1 >> 0x1f ^ 0xffffffffU));
}

Assistant:

stbi_inline static int stbi__extend_receive(stbi__jpeg *j, int n)
{
   unsigned int k;
   int sgn;
   if (j->code_bits < n) stbi__grow_buffer_unsafe(j);

   sgn = (stbi__int32)j->code_buffer >> 31; // sign bit is always in MSB
   k = stbi_lrot(j->code_buffer, n);
   STBI_ASSERT(n >= 0 && n < (int) (sizeof(stbi__bmask)/sizeof(*stbi__bmask)));
   j->code_buffer = k & ~stbi__bmask[n];
   k &= stbi__bmask[n];
   j->code_bits -= n;
   return k + (stbi__jbias[n] & ~sgn);
}